

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O1

size_t __thiscall proto2_unittest::Aggregate::ByteSizeLong(Aggregate *this)

{
  int iVar1;
  long lVar2;
  anon_union_56_1_493b367e_for_Aggregate_5 aVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  
  aVar3 = this->field_0;
  if (((undefined1  [56])aVar3 & (undefined1  [56])0x3f) == (undefined1  [56])0x0) {
    sVar7 = 0;
  }
  else {
    if (((undefined1  [56])aVar3 & (undefined1  [56])0x1) == (undefined1  [56])0x0) {
      sVar7 = 0;
    }
    else {
      lVar2 = *(long *)(((ulong)(this->field_0)._impl_.s_.tagged_ptr_.ptr_ & 0xfffffffffffffffc) + 8
                       );
      uVar4 = (uint)lVar2 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = lVar2 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [56])aVar3 & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
      sVar5 = ByteSizeLong((this->field_0)._impl_.sub_);
      uVar4 = (uint)sVar5 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [56])aVar3 & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
      sVar5 = google::protobuf::FileOptions::ByteSizeLong((this->field_0)._impl_.file_);
      uVar4 = (uint)sVar5 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [56])aVar3 & (undefined1  [56])0x8) != (undefined1  [56])0x0) {
      sVar5 = AggregateMessageSet::ByteSizeLong((this->field_0)._impl_.mset_);
      uVar4 = (uint)sVar5 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [56])aVar3 & (undefined1  [56])0x10) != (undefined1  [56])0x0) {
      sVar5 = google::protobuf::Any::ByteSizeLong((this->field_0)._impl_.any_);
      uVar4 = (uint)sVar5 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [56])aVar3 & (undefined1  [56])0x20) != (undefined1  [56])0x0) {
      uVar6 = (long)(this->field_0)._impl_.i_ | 1;
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
  }
  sVar7 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar7,&(this->field_0)._impl_._cached_size_);
  return sVar7;
}

Assistant:

::size_t Aggregate::ByteSizeLong() const {
  const Aggregate& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.Aggregate)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    // optional string s = 2;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_s());
    }
    // optional .proto2_unittest.Aggregate sub = 3;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.sub_);
    }
    // optional .google.protobuf.FileOptions file = 4;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.file_);
    }
    // optional .proto2_unittest.AggregateMessageSet mset = 5;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.mset_);
    }
    // optional .google.protobuf.Any any = 6;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.any_);
    }
    // optional int32 i = 1;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_i());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}